

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O1

void __thiscall gimage::TIFFImageIO::save(TIFFImageIO *this,ImageU8 *image,char *name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  pointer puVar8;
  IOException *pIVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> line;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lVar7 = TIFFOpen(name,"w");
  if (lVar7 == 0) {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_48,name,(allocator *)&local_60);
    std::operator+(&local_80,"Cannot store image: ",&local_48);
    gutil::IOException::IOException(pIVar9,&local_80);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  TIFFSetField(lVar7,0x100,(int)image->width);
  TIFFSetField(lVar7,0x101,(int)image->height);
  TIFFSetField(lVar7,0x115,(short)image->depth);
  TIFFSetField(lVar7,0x102,8);
  TIFFSetField(lVar7,0x153,1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)image->depth * image->width;
  auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x2000);
  uVar4 = SUB164(auVar2 / auVar1,0);
  if (uVar4 < 2) {
    uVar4 = 1;
  }
  uVar3 = (uint)image->height;
  if ((int)uVar4 < (int)uVar3) {
    uVar3 = uVar4;
  }
  uVar5 = TIFFDefaultStripSize(lVar7,uVar3,SUB168(auVar2 % auVar1,0));
  TIFFSetField(lVar7,0x116,uVar5);
  TIFFSetField(lVar7,0x112,1);
  TIFFSetField(lVar7,0x11c,1);
  TIFFSetField(lVar7,0x106,(image->depth - 3U < 2) + '\x01');
  if ((long)image->depth == 1) {
    if (0 < image->height) {
      uVar12 = 0;
      do {
        iVar6 = TIFFWriteScanline(lVar7,(*image->img)[uVar12],uVar12 & 0xffffffff,0);
        if (iVar6 < 0) {
          TIFFClose(lVar7);
          pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)&local_48,name,(allocator *)&local_60);
          std::operator+(&local_80,"Cannot write image data: ",&local_48);
          gutil::IOException::IOException(pIVar9,&local_80);
          __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
        }
        uVar12 = uVar12 + 1;
      } while ((long)uVar12 < image->height);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_60,(long)image->depth * image->width,(allocator_type *)&local_80);
    if (0 < image->height) {
      uVar12 = 0;
      do {
        if (0 < image->width) {
          lVar10 = 0;
          puVar8 = local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            if (0 < image->depth) {
              lVar11 = 0;
              do {
                puVar8[lVar11] = image->img[lVar11][uVar12][lVar10];
                lVar11 = lVar11 + 1;
              } while (lVar11 < image->depth);
              puVar8 = puVar8 + lVar11;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < image->width);
        }
        iVar6 = TIFFWriteScanline(lVar7,local_60.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                  uVar12 & 0xffffffff);
        if (iVar6 < 0) {
          TIFFClose(lVar7);
          pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)&local_48,name,&local_81);
          std::operator+(&local_80,"Cannot write image data: ",&local_48);
          gutil::IOException::IOException(pIVar9,&local_80);
          __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
        }
        uVar12 = uVar12 + 1;
      } while ((long)uVar12 < image->height);
    }
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  TIFFClose(lVar7);
  return;
}

Assistant:

void TIFFImageIO::save(const ImageU8 &image, const char *name) const
{
  saveInternal(image, name);
}